

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

void __thiscall OpenSSLWrapper::SslUdpContext::SslUdpContext(SslUdpContext *this)

{
  SSL_METHOD *sslMethod;
  
  sslMethod = (SSL_METHOD *)DTLS_method();
  SslContext::SslContext(&this->super_SslContext,sslMethod);
  (this->super_SslContext)._vptr_SslContext = (_func_int **)&PTR__SslContext_00146a60;
  SSL_CTX_set_options((this->super_SslContext).m_ctx,0x2430000);
  SSL_CTX_ctrl((SSL_CTX *)(this->super_SslContext).m_ctx,0x21,4,(void *)0x0);
  SSL_CTX_ctrl((SSL_CTX *)(this->super_SslContext).m_ctx,0x21,0x10,(void *)0x0);
  SSL_CTX_set_verify((SSL_CTX *)(this->super_SslContext).m_ctx,1,verify_callback);
  SSL_CTX_set_cipher_list
            ((SSL_CTX *)(this->super_SslContext).m_ctx,
             "EECDH+AESGCM:EDH+AESGCM:ECDHE-RSA-AES128-GCM-SHA256:AES256+EECDH:DHE-RSA-AES128-GCM-SHA256:AES256+EDH:ECDHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-SHA384:ECDHE-RSA-AES128-SHA256:ECDHE-RSA-AES256-SHA:ECDHE-RSA-AES128-SHA:DHE-RSA-AES256-SHA256:DHE-RSA-AES128-SHA256:DHE-RSA-AES256-SHA:DHE-RSA-AES128-SHA:ECDHE-RSA-DES-CBC3-SHA:EDH-RSA-DES-CBC3-SHA:AES256-GCM-SHA384:AES128-GCM-SHA256:AES256-SHA256:AES128-SHA256:AES256-SHA:AES128-SHA:DES-CBC3-SHA:HIGH:!aNULL:!eNULL:!EXPORT:!DES:!MD5:!PSK:!RC4"
            );
  return;
}

Assistant:

SslUdpContext::SslUdpContext() noexcept : SslContext(DTLS_method())
    {
        SSL_CTX_set_options(m_ctx, SSL_OP_CIPHER_SERVER_PREFERENCE | SSL_OP_SINGLE_DH_USE | SSL_OP_SINGLE_ECDH_USE | SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_COMPRESSION | SSL_OP_NO_SESSION_RESUMPTION_ON_RENEGOTIATION);
        SSL_CTX_set_mode(m_ctx, SSL_MODE_AUTO_RETRY);
        SSL_CTX_set_mode(m_ctx, SSL_MODE_RELEASE_BUFFERS);
        SSL_CTX_set_verify(m_ctx, SSL_VERIFY_PEER, verify_callback);
#if OPENSSL_VERSION_NUMBER < 0x10100000L
        SSL_CTX_set_ecdh_auto(m_ctx, 1);
#endif
        SSL_CTX_set_cipher_list(m_ctx, "EECDH+AESGCM:EDH+AESGCM:ECDHE-RSA-AES128-GCM-SHA256:AES256+EECDH:DHE-RSA-AES128-GCM-SHA256:AES256+EDH:ECDHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-SHA384:ECDHE-RSA-AES128-SHA256:ECDHE-RSA-AES256-SHA:ECDHE-RSA-AES128-SHA:DHE-RSA-AES256-SHA256:DHE-RSA-AES128-SHA256:DHE-RSA-AES256-SHA:DHE-RSA-AES128-SHA:ECDHE-RSA-DES-CBC3-SHA:EDH-RSA-DES-CBC3-SHA:AES256-GCM-SHA384:AES128-GCM-SHA256:AES256-SHA256:AES128-SHA256:AES256-SHA:AES128-SHA:DES-CBC3-SHA:HIGH:!aNULL:!eNULL:!EXPORT:!DES:!MD5:!PSK:!RC4");
    }